

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdset.c
# Opt level: O2

int ox_fdset_poll(fdset_s *self,long overtime)

{
  int iVar1;
  int *piVar2;
  
  iVar1 = poll((pollfd *)self->pollFds,(long)self->nfds,(int)overtime);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    iVar1 = -(uint)(*piVar2 != 4);
  }
  return iVar1;
}

Assistant:

int 
ox_fdset_poll(struct fdset_s* self, long overtime)
{
#if defined PLATFORM_WINDOWS
    int ret = WSAPoll(&self->pollFds[0], self->nfds, overtime);
#else
    int ret = poll(self->pollFds, self->nfds, overtime);
#endif

    if(ret == SOCKET_ERROR)
    {
        ret = (sErrno != S_EINTR) ? -1 : 0;
    }

    return ret;
}